

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

void llvm::sys::path::replace_extension(SmallVectorImpl<char> *path,Twine *extension,Style style)

{
  anon_unknown_dwarf_34f7078 *this;
  long lVar1;
  undefined8 uVar2;
  char *in_start;
  size_t sVar3;
  Style style_00;
  ulong uVar4;
  ulong uVar5;
  StringRef SVar7;
  undefined1 local_70 [8];
  SmallString<32U> ext_storage;
  char local_31;
  ulong uVar6;
  
  this = (anon_unknown_dwarf_34f7078 *)
         (path->super_SmallVectorTemplateBase<char,_true>).
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  uVar4 = (ulong)(path->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  local_70 = (undefined1  [8])
             &ext_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
              super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
              super_SmallVectorBase.Size;
  style_00 = windows;
  ext_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x2000000000;
  SVar7 = Twine::toStringRef(extension,(SmallVectorImpl<char> *)local_70);
  ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts._24_8_ =
       SVar7.Length;
  in_start = SVar7.Data;
  uVar6 = uVar4;
  do {
    uVar5 = uVar6 - 1;
    if (uVar6 == 0) goto LAB_00b26204;
    lVar1 = uVar6 - 1;
    uVar6 = uVar5;
  } while (this[lVar1] != (anon_unknown_dwarf_34f7078)0x2e);
  SVar7.Length._0_4_ = style;
  SVar7.Data = (char *)uVar4;
  SVar7.Length._4_4_ = 0;
  sVar3 = anon_unknown.dwarf_34f7078::filename_pos(this,SVar7,style_00);
  if (sVar3 <= uVar5) {
    if ((path->super_SmallVectorTemplateBase<char,_true>).
        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity < uVar5) {
      __assert_fail("N <= capacity()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                    ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
    }
    (path->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Size = (uint)uVar5;
  }
LAB_00b26204:
  uVar2 = ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts.
          _24_8_;
  if ((ext_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.InlineElts.
       _24_8_ != 0) && (*in_start != '.')) {
    local_31 = '.';
    SmallVectorTemplateBase<char,_true>::push_back
              (&path->super_SmallVectorTemplateBase<char,_true>,&local_31);
  }
  SmallVectorImpl<char>::append<char_const*,void>(path,in_start,in_start + uVar2);
  if (local_70 !=
      (undefined1  [8])
      &ext_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
       super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
       super_SmallVectorBase.Size) {
    free((void *)local_70);
  }
  return;
}

Assistant:

void replace_extension(SmallVectorImpl<char> &path, const Twine &extension,
                       Style style) {
  StringRef p(path.begin(), path.size());
  SmallString<32> ext_storage;
  StringRef ext = extension.toStringRef(ext_storage);

  // Erase existing extension.
  size_t pos = p.find_last_of('.');
  if (pos != StringRef::npos && pos >= filename_pos(p, style))
    path.set_size(pos);

  // Append '.' if needed.
  if (ext.size() > 0 && ext[0] != '.')
    path.push_back('.');

  // Append extension.
  path.append(ext.begin(), ext.end());
}